

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_thread.c
# Opt level: O0

void nhr_threads_joiner_clean(void)

{
  void *local_18;
  void *r;
  nhr_thread t;
  
  r = _threads_joiner->thread;
  local_18 = (void *)0x0;
  if ((nhr_thread)r != (nhr_thread)0x0) {
    _threads_joiner->thread = (nhr_thread)0x0;
    pthread_join(((nhr_thread)r)->thread,&local_18);
    if (local_18 != (void *)0x0) {
      __assert_fail("r == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/src/nhr_thread.c"
                    ,0x54,"void nhr_threads_joiner_clean(void)");
    }
    nhr_free(r);
  }
  return;
}

Assistant:

static void nhr_threads_joiner_clean(void) { // private
	nhr_thread t = _threads_joiner->thread;
#if defined(NHR_OS_WINDOWS)
	DWORD dwExitCode = 0;
#else
	void * r = NULL;
#endif

	if (!t) {
		return;
	}
	
	_threads_joiner->thread = NULL;

#if defined(NHR_OS_WINDOWS)
	do {
		if (GetExitCodeThread(t->thread, &dwExitCode) == 0) {
			break; // fail
		}
	} while (dwExitCode == STILL_ACTIVE);
	if (dwExitCode == STILL_ACTIVE) {
		TerminateThread(t->thread, 0);
	}
	if (CloseHandle(t->thread)) {
		t->thread = NULL;
	}
#else
	pthread_join(t->thread, &r);
	assert(r == NULL);
#endif
	nhr_free(t);
}